

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O0

Message * __thiscall hrgls::Message::Value_abi_cxx11_(Message *this)

{
  undefined4 uVar1;
  long *in_RSI;
  char *local_28;
  char *val;
  Message *this_local;
  string *ret;
  
  val._7_1_ = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  if (*(long *)*in_RSI == 0) {
    *(undefined4 *)(*in_RSI + 8) = 0x3ee;
  }
  else {
    local_28 = "";
    uVar1 = hrgls_MessageGetValue(*(undefined8 *)*in_RSI,&local_28);
    *(undefined4 *)(*in_RSI + 8) = uVar1;
    std::__cxx11::string::operator=((string *)this,local_28);
  }
  return this;
}

Assistant:

::std::string Message::Value() const
  {
    ::std::string ret;
    if (!m_private->Message) {
      m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
      return ret;
    }
    const char *val = "";
    m_private->status = hrgls_MessageGetValue(m_private->Message, &val);
    ret = val;
    return ret;
  }